

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O1

void __thiscall Refal2::CFunctionBuilder::AddEndOfRight(CFunctionBuilder *this)

{
  CNode<Refal2::CUnit> *pCVar1;
  CNodeType *fromNode;
  bool bVar2;
  _Elt_pointer ppCVar3;
  
  ppCVar3 = (this->balanceStack).c.
            super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppCVar3 !=
      (this->balanceStack).c.
      super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      if (ppCVar3 ==
          (this->balanceStack).c.
          super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        ppCVar3 = (this->balanceStack).c.
                  super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      pCVar1 = ppCVar3[-1];
      std::deque<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>::
      pop_back(&(this->balanceStack).c);
      error(this,(((pCVar1->super_CUnit).type & UT_LeftParen) == 0) +
                 EC_UnclosedLeftParenInRightPart);
      ppCVar3 = (this->balanceStack).c.
                super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    } while (ppCVar3 !=
             (this->balanceStack).c.
             super__Deque_base<Refal2::CNode<Refal2::CUnit>_*,_std::allocator<Refal2::CNode<Refal2::CUnit>_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if ((this->super_CVariablesBuilder).field_0x1aac == '\0') {
    error(this,EC_ThereAreNoPartsSeparatorInRules);
  }
  bVar2 = CErrorsHelper::HasErrors((CErrorsHelper *)this);
  if (bVar2) {
    fromNode = (this->acc).super_CNodeList<Refal2::CUnit>.first;
    if (fromNode != (CNodeType *)0x0) {
      CNodeList<Refal2::CUnit>::Remove
                (&(this->acc).super_CNodeList<Refal2::CUnit>,fromNode,
                 (this->acc).super_CNodeList<Refal2::CUnit>.last);
    }
    (this->acc).super_CNodeList<Refal2::CUnit>.first = (CNodeType *)0x0;
    (this->acc).super_CNodeList<Refal2::CUnit>.last = (CNodeType *)0x0;
    CVariablesBuilder::Reset(&this->super_CVariablesBuilder);
  }
  else {
    addRule(this);
  }
  *(undefined2 *)&(this->super_CVariablesBuilder).field_0x1aac = 0;
  return;
}

Assistant:

void CFunctionBuilder::AddEndOfRight()
{
	while( !balanceStack.empty() ) {
		CUnitNode* unit = balanceStack.top();
		balanceStack.pop();
		error( unit->IsLeftParen() ? EC_UnclosedLeftParenInRightPart :
			EC_UnclosedLeftBracketInRightPart );
	}
	if( !isProcessRightPart ) {
		error( EC_ThereAreNoPartsSeparatorInRules );
	}
	if( HasErrors() ) {
		acc.Empty();
		CVariablesBuilder::Reset();
	} else {
		addRule();
	}
	isRightDirection = false; // reset right direction flag
	isProcessRightPart = false;
}